

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_declaration.c
# Opt level: O2

char parse_struct_declaration(Translation_Data *translation_data,Scope *struct_scope,Queue *members)

{
  char cVar1;
  Denotation_Prototype *prototype;
  Denoted *declarator;
  char *error_message;
  
  prototype = parse_specifier_qualifier_list(translation_data,struct_scope);
  while( true ) {
    cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
    if (cVar1 != '\0') {
      free(prototype);
      return '\x01';
    }
    declarator = parse_struct_declarator(translation_data,struct_scope,prototype);
    if ((declarator == (Denoted *)0x0) || (declarator->denotation == DT_Error)) break;
    Scope_Push(struct_scope,declarator,translation_data);
    Queue_Push(members,declarator);
    cVar1 = get_and_check(translation_data,KW_COMMA);
    if ((cVar1 == '\0') && (cVar1 = check(translation_data,KW_SEMI_COLUMN,0), cVar1 == '\0')) {
      free(prototype);
      error_message = "semi column expected in struct declaration";
LAB_00141fe6:
      push_translation_error(error_message,translation_data);
      return '\0';
    }
  }
  free(prototype);
  error_message = "there is a problem with the declarator";
  goto LAB_00141fe6;
}

Assistant:

char parse_struct_declaration(struct Translation_Data *translation_data,struct Scope *struct_scope,struct Queue* members)
{
	struct Denotation_Prototype *prototype;
	struct Denoted *hold;
	prototype=parse_specifier_qualifier_list(translation_data,struct_scope);
	while(!get_and_check(translation_data,KW_SEMI_COLUMN))
	{
		hold=parse_struct_declarator(translation_data,struct_scope,prototype);
		if(hold!=NULL && hold->denotation!=DT_Error)
		{
			Scope_Push(struct_scope,hold,translation_data);
			Queue_Push(members,hold);

		}else
		{
			free(prototype);
			push_translation_error("there is a problem with the declarator",translation_data);
			return 0;
		}

		if(!get_and_check(translation_data,KW_COMMA) && !check(translation_data,KW_SEMI_COLUMN,0))
		{
			free(prototype);
			push_translation_error("semi column expected in struct declaration",translation_data);
			return 0;
		}
	}
	free(prototype);
	return 1;

}